

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock_tests.cpp
# Opt level: O2

void __thiscall
merkleblock_tests::merkleblock_construct_from_txids_not_found::test_method
          (merkleblock_construct_from_txids_not_found *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  string *psVar3;
  long in_FS_OFFSET;
  string_view hex;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined **local_258;
  undefined1 local_250;
  undefined1 *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  string local_1f0;
  uint256 local_1d0;
  string local_1b0;
  CMerkleBlock merkleBlock;
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  txids2;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  getBlock13b8a();
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &txids2._M_t._M_impl.super__Rb_tree_header._M_header;
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  txids2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  hex._M_str = "c0ffee00003bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20";
  hex._M_len = 0x40;
  txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       txids2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  transaction_identifier<false>::FromHex
            ((optional<transaction_identifier<false>_> *)&merkleBlock,hex);
  if (merkleBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    std::
    _Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
    ::_M_insert_unique<transaction_identifier<false>>
              ((_Rb_tree<transaction_identifier<false>,transaction_identifier<false>,std::_Identity<transaction_identifier<false>>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>
                *)&txids2,(transaction_identifier<false> *)&merkleBlock);
    CMerkleBlock::CMerkleBlock(&merkleBlock,&block,&txids2);
    local_228 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_220 = "";
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x45;
    file.m_begin = (iterator)&local_228;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_238,msg);
    local_250 = 0;
    local_258 = &PTR__lazy_ostream_011480b0;
    local_248 = boost::unit_test::lazy_ostream::inst;
    local_240 = "";
    local_268 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_260 = "";
    CBlockHeader::GetHash(&local_1d0,&merkleBlock.header);
    base_blob<256u>::GetHex_abi_cxx11_(&local_1b0,(base_blob<256u> *)&local_1d0);
    CBlockHeader::GetHash((uint256 *)&vMatched,&block.super_CBlockHeader);
    base_blob<256u>::GetHex_abi_cxx11_(&local_1f0,(base_blob<256u> *)&vMatched);
    pvVar2 = (iterator)0x2;
    psVar3 = &local_1b0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_258,&local_268,0x45,1,2,psVar3,"merkleBlock.header.GetHash().GetHex()",
               &local_1f0,"block.GetHash().GetHex()");
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1b0);
    local_278 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_270 = "";
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    local_280 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x46;
    file_00.m_begin = (iterator)&local_278;
    msg_00.m_end = (iterator)psVar3;
    msg_00.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_288,
               msg_00);
    local_250 = 0;
    local_258 = &PTR__lazy_ostream_011480b0;
    local_248 = boost::unit_test::lazy_ostream::inst;
    local_240 = "";
    local_298 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_290 = "";
    local_1b0._M_dataplus._M_p =
         (pointer)(((long)merkleBlock.vMatchedTxn.
                          super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)merkleBlock.vMatchedTxn.
                         super__Vector_base<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x24);
    psVar3 = &local_1b0;
    local_1d0.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_1d0.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_1d0.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_1d0.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    pvVar2 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&local_258,&local_298,0x46,1,2,psVar3,"merkleBlock.vMatchedTxn.size()",
               (base_blob<256u> *)&local_1d0,"0U");
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_2c0 = "";
    local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x4b;
    file_01.m_begin = (iterator)&local_2c8;
    msg_01.m_end = (iterator)psVar3;
    msg_01.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2d8,
               msg_01);
    local_250 = 0;
    local_258 = &PTR__lazy_ostream_011480b0;
    local_248 = boost::unit_test::lazy_ostream::inst;
    local_240 = "";
    local_2e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_2e0 = "";
    CPartialMerkleTree::ExtractMatches(&local_1d0,&merkleBlock.txn,&vMatched,&vIndex);
    base_blob<256u>::GetHex_abi_cxx11_(&local_1b0,(base_blob<256u> *)&local_1d0);
    base_blob<256u>::GetHex_abi_cxx11_
              (&local_1f0,(base_blob<256u> *)&block.super_CBlockHeader.hashMerkleRoot);
    pvVar2 = (iterator)0x2;
    psVar3 = &local_1b0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_258,&local_2e8,0x4b,1,2,psVar3,
               "merkleBlock.txn.ExtractMatches(vMatched, vIndex).GetHex()",&local_1f0,
               "block.hashMerkleRoot.GetHex()");
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1b0);
    local_2f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_2f0 = "";
    local_308 = &boost::unit_test::basic_cstring<char_const>::null;
    local_300 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x4c;
    file_02.m_begin = (iterator)&local_2f8;
    msg_02.m_end = (iterator)psVar3;
    msg_02.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_308,
               msg_02);
    local_250 = 0;
    local_258 = &PTR__lazy_ostream_011480b0;
    local_248 = boost::unit_test::lazy_ostream::inst;
    local_240 = "";
    local_318 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_310 = "";
    local_1b0._M_dataplus._M_p =
         (pointer)((long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_start >> 5);
    psVar3 = &local_1b0;
    local_1d0.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_1d0.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_1d0.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_1d0.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    pvVar2 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&local_258,&local_318,0x4c,1,2,psVar3,"vMatched.size()",(base_blob<256u> *)&local_1d0
               ,"0U");
    local_328 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_320 = "";
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    local_330 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x4d;
    file_03.m_begin = (iterator)&local_328;
    msg_03.m_end = (iterator)psVar3;
    msg_03.m_begin = pvVar2;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_338,
               msg_03);
    local_250 = 0;
    local_258 = &PTR__lazy_ostream_011480b0;
    local_248 = boost::unit_test::lazy_ostream::inst;
    local_240 = "";
    local_348 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkleblock_tests.cpp"
    ;
    local_340 = "";
    local_1b0._M_dataplus._M_p =
         (pointer)((long)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2);
    local_1d0.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_1d0.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_1d0.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_1d0.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&local_258,&local_348,0x4d,1,2,&local_1b0,"vIndex.size()",
               (base_blob<256u> *)&local_1d0,"0U");
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              (&vMatched.super__Vector_base<uint256,_std::allocator<uint256>_>);
    CMerkleBlock::~CMerkleBlock(&merkleBlock);
    std::
    _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
    ::~_Rb_tree(&txids2._M_t);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&block.vtx);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkleblock_construct_from_txids_not_found)
{
    CBlock block = getBlock13b8a();

    std::set<Txid> txids2;
    txids2.insert(Txid::FromHex("c0ffee00003bafa802c8aa084379aa98d9fcd632ddc2ed9782b586ec87451f20").value());
    CMerkleBlock merkleBlock(block, txids2);

    BOOST_CHECK_EQUAL(merkleBlock.header.GetHash().GetHex(), block.GetHash().GetHex());
    BOOST_CHECK_EQUAL(merkleBlock.vMatchedTxn.size(), 0U);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;

    BOOST_CHECK_EQUAL(merkleBlock.txn.ExtractMatches(vMatched, vIndex).GetHex(), block.hashMerkleRoot.GetHex());
    BOOST_CHECK_EQUAL(vMatched.size(), 0U);
    BOOST_CHECK_EQUAL(vIndex.size(), 0U);
}